

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O1

void anon_unknown.dwarf_2d2522::fillPixels(Array2D<half> *ph,int width,int height)

{
  short sVar1;
  long lVar2;
  half *phVar3;
  double dVar4;
  double dVar5;
  unsigned_short uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  
  if (0 < height) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      if (0 < width) {
        uVar7 = 0;
        do {
          dVar4 = sin((double)(int)uVar7);
          dVar5 = sin((double)(int)uVar9 * 0.5);
          fVar10 = (float)(dVar5 + dVar4);
          lVar2 = ph->_sizeY;
          phVar3 = ph->_data;
          if ((fVar10 != 0.0) || (NAN(fVar10))) {
            sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar10 >> 0x17) * 2);
            if (sVar1 == 0) {
              uVar6 = half::convert((int)fVar10);
            }
            else {
              uVar6 = sVar1 + (short)(((uint)fVar10 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar6 = (unsigned_short)((uint)fVar10 >> 0x10);
          }
          *(unsigned_short *)((long)&phVar3[uVar7]._h + lVar2 * lVar8) = uVar6;
          uVar7 = uVar7 + 1;
        } while ((uint)width != uVar7);
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 2;
    } while (uVar9 != (uint)height);
  }
  return;
}

Assistant:

void
fillPixels (Array2D<half> &ph, int width, int height)
{
    for (int y = 0; y < height; ++y)
	for (int x = 0; x < width; ++x)
	    ph[y][x] = sin (double (x)) + sin (y * 0.5);
}